

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O3

ircode_t * ircode_create(uint16_t nlocals)

{
  ircode_t *__ptr;
  code_r *pcVar1;
  ircode_t *piVar2;
  
  __ptr = (ircode_t *)gravity_calloc((gravity_vm *)0x0,1,0x290);
  piVar2 = (ircode_t *)0x0;
  if (__ptr != (ircode_t *)0x0) {
    __ptr->label_counter = 0;
    __ptr->maxtemp = 0;
    __ptr->nlocals = nlocals;
    __ptr->ntemps = 0;
    __ptr->error = false;
    pcVar1 = (code_r *)gravity_calloc((gravity_vm *)0x0,1,0x18);
    __ptr->list = pcVar1;
    if (pcVar1 == (code_r *)0x0) {
      free(__ptr);
      piVar2 = (ircode_t *)0x0;
    }
    else {
      pcVar1->n = 0;
      pcVar1->m = 0;
      pcVar1->p = (inst_t **)0x0;
      memset(__ptr->state + 1,0,0xff);
      (__ptr->label_true).n = 0;
      (__ptr->label_true).m = 0;
      (__ptr->label_true).p = (uint32_t *)0x0;
      (__ptr->label_false).n = 0;
      (__ptr->label_false).m = 0;
      (__ptr->label_false).p = (uint32_t *)0x0;
      (__ptr->label_check).n = 0;
      (__ptr->label_check).m = 0;
      (__ptr->label_check).p = (uint32_t *)0x0;
      (__ptr->registers).n = 0;
      (__ptr->registers).m = 0;
      (__ptr->registers).p = (uint32_t *)0x0;
      (__ptr->context).n = 0;
      (__ptr->context).m = 0;
      (__ptr->context).p = (_Bool **)0x0;
      __ptr->state[0] = true;
      piVar2 = __ptr;
      if (nlocals != 0) {
        memset(__ptr->state,1,(ulong)nlocals);
      }
    }
  }
  return piVar2;
}

Assistant:

ircode_t *ircode_create (uint16_t nlocals) {
    ircode_t *code = (ircode_t *)mem_alloc(NULL, sizeof(ircode_t));
    if (!code) return NULL;
    code->label_counter = 0;
    code->nlocals = nlocals;
    code->ntemps = 0;
    code->maxtemp = 0;
    code->error = false;

    code->list = mem_alloc(NULL, sizeof(code_r));
    if (!code->list) {
        mem_free(code);
        return NULL;
    }
    marray_init(*code->list);
    marray_init(code->label_true);
    marray_init(code->label_false);
    marray_init(code->label_check);
    marray_init(code->registers);
    marray_init(code->context);

    // init state array (register 0 is reserved)
    bzero(code->state, MAX_REGISTERS * sizeof(bool));
    code->state[0] = true;
    for (uint32_t i=0; i<nlocals; ++i) {
        code->state[i] = true;
    }
    return code;
}